

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

cgltf_size cgltf_component_read_index(void *in,cgltf_component_type component_type)

{
  ulong uVar1;
  cgltf_component_type component_type_local;
  void *in_local;
  
  switch(component_type) {
  case cgltf_component_type_r_8:
    in_local = (void *)(long)*in;
    break;
  case cgltf_component_type_r_8u:
    in_local = (void *)(ulong)*in;
    break;
  case cgltf_component_type_r_16:
    in_local = (void *)(long)*in;
    break;
  case cgltf_component_type_r_16u:
    in_local = (void *)(ulong)*in;
    break;
  case cgltf_component_type_r_32u:
    in_local = (void *)(ulong)*in;
    break;
  case cgltf_component_type_r_32f:
    uVar1 = (ulong)*in;
    in_local = (void *)(uVar1 | (long)(*in - 9.223372e+18) & (long)uVar1 >> 0x3f);
    break;
  default:
    in_local = (void *)0x0;
  }
  return (cgltf_size)in_local;
}

Assistant:

static cgltf_size cgltf_component_read_index(const void* in, cgltf_component_type component_type)
{
    switch (component_type)
    {
        case cgltf_component_type_r_16:
            return *((const int16_t*) in);
        case cgltf_component_type_r_16u:
            return *((const uint16_t*) in);
        case cgltf_component_type_r_32u:
            return *((const uint32_t*) in);
        case cgltf_component_type_r_32f:
            return (cgltf_size)*((const float*) in);
        case cgltf_component_type_r_8:
            return *((const int8_t*) in);
        case cgltf_component_type_r_8u:
            return *((const uint8_t*) in);
        default:
            return 0;
    }
}